

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_NodeStore * UA_NodeStore_new(void)

{
  uint uVar1;
  UA_NodeStore *__ptr;
  UA_NodeStoreEntry **ppUVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  __ptr = (UA_NodeStore *)malloc(0x18);
  if (__ptr != (UA_NodeStore *)0x0) {
    uVar1 = 0x1e;
    uVar3 = 0;
    do {
      uVar5 = uVar3 & 0xffff;
      iVar4 = (uVar1 & 0xffff) - uVar5;
      uVar6 = (uint)(iVar4 - (iVar4 >> 0x1f)) >> 1;
      uVar3 = uVar5 + uVar6;
      bVar7 = 3 < (ushort)uVar3;
      uVar1 = uVar1 & 0xffff;
      if (bVar7) {
        uVar1 = uVar3;
      }
      uVar3 = uVar5 + 1 + uVar6;
      if (bVar7) {
        uVar3 = uVar5;
      }
    } while ((short)uVar3 != (short)uVar1);
    __ptr->sizePrimeIndex = uVar3 & 0xffff;
    uVar1 = primes[uVar3 & 0xffff];
    __ptr->size = uVar1;
    __ptr->count = 0;
    ppUVar2 = (UA_NodeStoreEntry **)calloc((ulong)uVar1,8);
    __ptr->entries = ppUVar2;
    if (ppUVar2 != (UA_NodeStoreEntry **)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (UA_NodeStore *)0x0;
}

Assistant:

UA_NodeStore *
UA_NodeStore_new(void) {
    UA_NodeStore *ns = UA_malloc(sizeof(UA_NodeStore));
    if(!ns)
        return NULL;
    ns->sizePrimeIndex = higher_prime_index(UA_NODESTORE_MINSIZE);
    ns->size = primes[ns->sizePrimeIndex];
    ns->count = 0;
    ns->entries = UA_calloc(ns->size, sizeof(UA_NodeStoreEntry*));
    if(!ns->entries) {
        UA_free(ns);
        return NULL;
    }
    return ns;
}